

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O0

void quicly_sendstate_init(quicly_sendstate_t *state)

{
  uint64_t in_RDI;
  
  quicly_ranges_init_with_range(&state->acked,in_RDI,0x15ecc5);
  quicly_ranges_init((quicly_ranges_t *)(in_RDI + 0x28));
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0xffffffffffffffff;
  return;
}

Assistant:

void quicly_sendstate_init(quicly_sendstate_t *state)
{
    quicly_ranges_init_with_range(&state->acked, 0, 0);
    quicly_ranges_init(&state->pending);
    state->size_inflight = 0;
    state->final_size = UINT64_MAX;
}